

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

char __thiscall BenevolentBotStrategy::yesOrNo(BenevolentBotStrategy *this,StrategyContext context)

{
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  
  if (context == REINFORCE) {
    cVar2 = 'y';
  }
  else {
    cVar2 = 'n';
    if (context == FORTIFY) {
      bVar1 = canFortify(this);
      cVar2 = 'n';
      if (bVar1) {
        cVar2 = 'y';
      }
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,cVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  return cVar2;
}

Assistant:

signed char BenevolentBotStrategy::yesOrNo(StrategyContext context) {
    char botChoice = 0;
    switch ((int) context) {
        case StrategyContext::ATTACK:
            botChoice = 'n';
            break;
        case StrategyContext::FORTIFY:
            botChoice = canFortify() ? 'y' : 'n';
            break;
        case StrategyContext::REINFORCE:
            botChoice = 'y';
            break;
        default: {
            botChoice = 'n';
        }
    }
    std::cout << botChoice << std::endl;
    return botChoice;
}